

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O2

int xmlModuleSymbol(xmlModulePtr module,char *name,void **symbol)

{
  void *pvVar1;
  long lVar2;
  char *msg;
  
  if (((name == (char *)0x0) || (module == (xmlModulePtr)0x0)) || (symbol == (void **)0x0)) {
    msg = "null parameter\n";
    name = (char *)0x0;
  }
  else {
    pvVar1 = (void *)dlsym();
    *symbol = pvVar1;
    lVar2 = dlerror();
    if (lVar2 == 0) {
      return 0;
    }
    msg = "failed to find symbol: %s\n";
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (void *)0x0,0x1a,0x1324,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,name,(char *)0x0,0
                  ,0,msg);
  return -1;
}

Assistant:

int
xmlModuleSymbol(xmlModulePtr module, const char *name, void **symbol)
{
    int rc = -1;

    if ((NULL == module) || (symbol == NULL) || (name == NULL)) {
        __xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_MODULE,
                        XML_MODULE_OPEN, XML_ERR_FATAL, NULL, 0, 0,
                        NULL, NULL, 0, 0, "null parameter\n");
        return rc;
    }

    rc = xmlModulePlatformSymbol(module->handle, name, symbol);

    if (rc == -1) {
        __xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_MODULE,
                        XML_MODULE_OPEN, XML_ERR_FATAL, NULL, 0, 0,
                        name, NULL, 0, 0,
                        "failed to find symbol: %s\n",
			(name == NULL ? "NULL" : name));
        return rc;
    }

    return rc;
}